

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.hpp
# Opt level: O3

void __thiscall
ft::list<ft::pair<int,_int>,_ft::allocator<ft::pair<int,_int>_>_>::~list
          (list<ft::pair<int,_int>,_ft::allocator<ft::pair<int,_int>_>_> *this)

{
  clear(this);
  operator_delete(this->m_head);
  operator_delete(this->m_tail);
  return;
}

Assistant:

~list() {
		this->clear();
		this->listTerminate();
	}